

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Trigger * sqlite3TriggerList(Parse *pParse,Table *pTab)

{
  byte bVar1;
  Parse *pPVar2;
  Trigger *pTVar3;
  Trigger *pTVar4;
  long *plVar5;
  long lVar6;
  
  pTVar4 = pTab->pTrigger;
  plVar5 = *(long **)&pParse->szOpAlloc;
  if (plVar5 == (long *)0x0) {
    return pTVar4;
  }
  pPVar2 = (Parse *)pTab->pSchema;
LAB_001885c4:
  pTVar3 = (Trigger *)plVar5[2];
  if (((Parse *)pTVar3->pTabSchema == pPVar2) && (pTVar3->table != (char *)0x0)) {
    lVar6 = 0;
    do {
      bVar1 = pTVar3->table[lVar6];
      if (bVar1 == pTab->zName[lVar6]) {
        if ((ulong)bVar1 == 0) goto LAB_00188628;
      }
      else if (""[bVar1] != ""[(byte)pTab->zName[lVar6]]) break;
      lVar6 = lVar6 + 1;
    } while( true );
  }
  goto LAB_001885ce;
LAB_00188628:
  if ((pPVar2 == pParse) && (pTVar3->bReturning == '\0')) {
LAB_001885ce:
    if (pTVar3->op != 0x97) goto LAB_001885eb;
    pTVar3->table = pTab->zName;
    pTVar3->pTabSchema = (Schema *)pPVar2;
  }
  pTVar3->pNext = pTVar4;
  pTVar4 = pTVar3;
LAB_001885eb:
  plVar5 = (long *)*plVar5;
  if (plVar5 == (long *)0x0) {
    return pTVar4;
  }
  goto LAB_001885c4;
}

Assistant:

SQLITE_PRIVATE Trigger *sqlite3TriggerList(Parse *pParse, Table *pTab){
  Schema *pTmpSchema;       /* Schema of the pTab table */
  Trigger *pList;           /* List of triggers to return */
  HashElem *p;              /* Loop variable for TEMP triggers */

  assert( pParse->disableTriggers==0 );
  pTmpSchema = pParse->db->aDb[1].pSchema;
  p = sqliteHashFirst(&pTmpSchema->trigHash);
  pList = pTab->pTrigger;
  while( p ){
    Trigger *pTrig = (Trigger *)sqliteHashData(p);
    if( pTrig->pTabSchema==pTab->pSchema
     && pTrig->table
     && 0==sqlite3StrICmp(pTrig->table, pTab->zName)
     && (pTrig->pTabSchema!=pTmpSchema || pTrig->bReturning)
    ){
      pTrig->pNext = pList;
      pList = pTrig;
    }else if( pTrig->op==TK_RETURNING ){
#ifndef SQLITE_OMIT_VIRTUALTABLE
      assert( pParse->db->pVtabCtx==0 );
#endif
      assert( pParse->bReturning );
      assert( &(pParse->u1.pReturning->retTrig) == pTrig );
      pTrig->table = pTab->zName;
      pTrig->pTabSchema = pTab->pSchema;
      pTrig->pNext = pList;
      pList = pTrig;
    }
    p = sqliteHashNext(p);
  }
#if 0
  if( pList ){
    Trigger *pX;
    printf("Triggers for %s:", pTab->zName);
    for(pX=pList; pX; pX=pX->pNext){
      printf(" %s", pX->zName);
    }
    printf("\n");
    fflush(stdout);
  }
#endif
  return pList;
}